

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O1

int ON_SolveCubicEquation(double a,double b,double c,double d,double *r1,double *r2,double *r3)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  ulong in_XMM3_Qb;
  double dVar6;
  double dVar7;
  double rr0;
  double rr1;
  double local_68;
  double local_50;
  double local_48;
  double local_38;
  ulong uStack_30;
  double local_20;
  
  if ((a != 0.0) || (NAN(a))) {
    bVar1 = NAN(a);
    bVar2 = a == 1.0;
    dVar4 = d / a;
    if ((bVar2) && (!bVar1)) {
      dVar4 = d;
    }
    dVar7 = c / a;
    if ((bVar2) && (!bVar1)) {
      dVar7 = c;
    }
    dVar5 = b / a;
    if ((bVar2) && (!bVar1)) {
      dVar5 = b;
    }
    local_48 = (dVar5 * dVar5 + dVar7 * -3.0) / 9.0;
    dVar7 = (dVar4 * 27.0 + (dVar5 + dVar5) * dVar5 * dVar5 + dVar5 * -9.0 * dVar7) / 54.0;
    dVar4 = local_48 * local_48 * local_48;
    if (dVar7 * dVar7 < dVar4) {
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      local_38 = acos(dVar7 / dVar4);
      local_68 = SQRT(local_48);
      dVar4 = local_68;
      if (local_48 < 0.0) {
        dVar4 = sqrt(local_48);
      }
      dVar7 = cos(local_38 / 3.0);
      dVar5 = dVar5 / -3.0;
      *r1 = dVar7 * dVar4 * -2.0 + dVar5;
      dVar4 = local_68;
      if (local_48 < 0.0) {
        dVar4 = sqrt(local_48);
      }
      dVar7 = cos((local_38 + 6.283185307179586) / 3.0);
      *r2 = dVar7 * dVar4 * -2.0 + dVar5;
      if (local_48 < 0.0) {
        local_68 = sqrt(local_48);
      }
      dVar4 = cos((local_38 + -6.283185307179586) / 3.0);
      *r3 = dVar4 * local_68 * -2.0 + dVar5;
      dVar4 = *r1;
      if (*r2 < dVar4) {
        *r1 = *r2;
        *r2 = dVar4;
      }
      dVar4 = *r2;
      if (*r3 < dVar4) {
        *r2 = *r3;
        *r3 = dVar4;
      }
      local_20 = *r1;
      iVar3 = 3;
      if (local_20 <= *r2) {
        return 3;
      }
      *r1 = *r2;
      goto LAB_004f30f1;
    }
    dVar4 = dVar7 * dVar7 - dVar4;
    if (dVar4 < 0.0) {
      local_38 = ABS(dVar7);
      uStack_30 = in_XMM3_Qb & 0x7fffffffffffffff;
      dVar4 = sqrt(dVar4);
      dVar6 = local_38;
    }
    else {
      dVar4 = SQRT(dVar4);
      dVar6 = ABS(dVar7);
    }
    dVar4 = pow(dVar6 + dVar4,0.3333333333333333);
    dVar6 = (double)(-(ulong)(0.0 < dVar7) & (ulong)-dVar4 | ~-(ulong)(0.0 < dVar7) & (ulong)dVar4);
    dVar7 = (double)(-(ulong)(-dVar4 != dVar4) & (ulong)(local_48 / dVar6));
    dVar4 = dVar6 + dVar7;
    *r1 = dVar4 - dVar5 / 3.0;
    *r2 = dVar4 * -0.5 - dVar5 / 3.0;
    *r3 = (dVar6 - dVar7) * 1.224744871391589;
  }
  else {
    if ((b != 0.0) || (NAN(b))) {
      iVar3 = ON_SolveQuadraticEquation(b,c,d,&local_50,&local_20);
      if (iVar3 == 2) {
        *r1 = local_50;
        iVar3 = 0;
      }
      else {
        if ((iVar3 != 1) && (iVar3 != 0)) {
          return 0;
        }
        *r1 = local_50;
        iVar3 = 2;
      }
LAB_004f30f1:
      *r2 = local_20;
      return iVar3;
    }
    if ((c == 0.0) && (!NAN(c))) {
      return -1;
    }
    *r1 = -d / c;
  }
  return 1;
}

Assistant:

int ON_SolveCubicEquation(
  double a, double b, double c, double d,
  double* r1, double* r2, double* r3
)
{
  int rc = 0;
  if (a == 0.0)
  {
    if (b == 0.0)
    {
      if (c == 0.0)
      {
        // no roots
        rc = -1;
      }
      else
      {
        // linear equation
        *r1 = -d / c;
        rc = 1;
      }
    }
    else
    {
      // quadratic equation
      double rr0, rr1;
      int qrc = ON_SolveQuadraticEquation(b, c, d, &rr0, &rr1);
      switch (qrc)
      {
      case 0:
        // two distinct real roots (rr0 < rr1)
        *r1 = rr0;
        *r2 = rr1;
        rc = 2;
        break;
      case 1:
        // one real root (rr0 = rr1)
        *r1 = rr0;
        *r2 = rr1;
        rc = 2;
        break;
      case 2:
        // 2: two complex conjugate roots (rr0 +/- (rr1)*sqrt(-1))
        *r1 = rr0;
        *r2 = rr1;
        rc = 0;
        break;
      }
    }
  }
  else
  {
    if (a != 1.0)
    {
      // convert to normal form equation
      b = b / a;
      c = c / a;
      d = d / a;
      a = 1.0;
    }

    double Q = (b*b - 3.0 * c) / 9.0;
    double R = (2.0 * b*b*b - 9.0* b* c + 27.0 * d) / 54.0;

    if (R*R < Q*Q*Q)
    {
      // three real roots
      double Theta = acos(R / sqrt(Q*Q*Q));
      *r1 = -2.0 * sqrt(Q) * cos(Theta / 3.0) - b / 3.0;
      *r2 = -2.0 * sqrt(Q) * cos((Theta + 2.0*ON_PI) / 3.0) - b / 3.0;
      *r3 = -2.0 * sqrt(Q) * cos((Theta - 2.0*ON_PI) / 3.0) - b / 3.0;
      // inline bubble sort 
      if (*r1 > *r2) { double temp = *r1; *r1 = *r2; *r2 = temp; }
      if (*r2 > *r3) { double temp = *r2; *r2 = *r3; *r3 = temp; }
      if (*r1 > *r2) { double temp = *r1; *r1 = *r2; *r2 = temp; }
      rc = 3;
    }
    else
    {
      double A = pow(fabs(R) + sqrt(R*R - Q * Q*Q), 1.0 / 3.0);
      if (R > 0)
        A = -A;
      double B = 0;
      if (A != 0.0)
        B = Q / A;
      *r1 = (A + B) - b / 3;
      // the complex congate pair of roots are r2 +/- r3 i
      *r2 = -(A + B) / 2.0 - b / 3;
      *r3 = sqrt(3.0 / 2.0)*(A - B);
      rc = 1;
    }
  }
  return rc;
}